

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

int __thiscall
EnvironmentNAVXYTHETALATTICE::GetActionCost
          (EnvironmentNAVXYTHETALATTICE *this,int SourceX,int SourceY,int SourceTheta,
          EnvNAVXYTHETALATAction_t *action)

{
  uchar **ppuVar1;
  pointer psVar2;
  int iVar3;
  pointer psVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  
  iVar3 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])();
  iVar8 = 1000000000;
  if (((char)iVar3 != '\0') &&
     (iVar3 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])
                        (this,(ulong)(uint)(action->dX + SourceX),
                         (ulong)(uint)(action->dY + SourceY)), (char)iVar3 != '\0')) {
    ppuVar1 = (this->EnvNAVXYTHETALATCfg).Grid2D;
    bVar5 = (this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh;
    if (ppuVar1[(long)action->dX + (long)SourceX][(long)action->dY + (long)SourceY] < bVar5) {
      psVar2 = (action->interm3DcellsV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(action->interm3DcellsV).
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 2) *
              -0x5555555555555555;
      if ((int)(uint)uVar7 < 1) {
        bVar12 = 0;
      }
      else {
        piVar9 = &psVar2->y;
        uVar13 = 0;
        bVar11 = 0;
        do {
          if (uVar7 - uVar13 == 0) goto LAB_00127fa5;
          uVar14 = ((sbpl_xy_theta_cell_t *)(piVar9 + -1))->x + SourceX;
          if ((int)uVar14 < 0) {
            return 1000000000;
          }
          if ((this->EnvNAVXYTHETALATCfg).EnvWidth_c <= (int)uVar14) {
            return 1000000000;
          }
          uVar10 = *piVar9 + SourceY;
          if ((int)uVar10 < 0) {
            return 1000000000;
          }
          if ((this->EnvNAVXYTHETALATCfg).EnvHeight_c <= (int)uVar10) {
            return 1000000000;
          }
          bVar12 = ppuVar1[uVar14][uVar10];
          if (bVar5 <= bVar12) {
            return 1000000000;
          }
          if (bVar12 < bVar11) {
            bVar12 = bVar11;
          }
          uVar13 = uVar13 + 1;
          piVar9 = piVar9 + 3;
          bVar11 = bVar12;
        } while (((uint)uVar7 & 0x7fffffff) != uVar13);
      }
      if ((0x10 < (ulong)((long)(this->EnvNAVXYTHETALATCfg).FootprintPolygon.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->EnvNAVXYTHETALATCfg).FootprintPolygon.
                               super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl
                               .super__Vector_impl_data._M_start)) &&
         ((this->EnvNAVXYTHETALATCfg).cost_possibly_circumscribed_thresh <= (int)(uint)bVar12)) {
        checks = checks + 1;
        psVar4 = (action->intersectingcellsV).
                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = (long)(action->intersectingcellsV).
                       super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)psVar4 >> 3;
        if (0 < (int)uVar13) {
          uVar7 = 0;
          do {
            if (uVar13 <= uVar7) {
LAB_00127fa5:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar7);
            }
            iVar3 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])
                              (this,(ulong)(uint)(psVar4[uVar7].x + SourceX),
                               (ulong)(uint)(psVar4[uVar7].y + SourceY));
            if ((char)iVar3 == '\0') {
              return 1000000000;
            }
            uVar7 = uVar7 + 1;
            psVar4 = (action->intersectingcellsV).
                     super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = (long)(action->intersectingcellsV).
                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)psVar4;
            uVar13 = (long)uVar6 >> 3;
          } while ((long)uVar7 < (long)(int)(uVar6 >> 3));
        }
      }
      ppuVar1 = (this->EnvNAVXYTHETALATCfg).Grid2D;
      bVar5 = ppuVar1[SourceX][SourceY];
      if (bVar5 < bVar12) {
        bVar5 = bVar12;
      }
      bVar12 = ppuVar1[(long)action->dX + (long)SourceX][(long)action->dY + (long)SourceY];
      if (bVar5 <= bVar12) {
        bVar5 = bVar12;
      }
      iVar8 = (bVar5 + 1) * action->cost;
    }
  }
  return iVar8;
}

Assistant:

int EnvironmentNAVXYTHETALATTICE::GetActionCost(
    int SourceX, int SourceY, int SourceTheta,
    EnvNAVXYTHETALATAction_t* action)
{
    sbpl_2Dcell_t cell;
    sbpl_xy_theta_cell_t interm3Dcell;
    int i;

    // TODO - go over bounding box (minpt and maxpt) to test validity and skip
    // testing boundaries below, also order intersect cells so that the four
    // farthest pts go first

    if (!IsValidCell(SourceX, SourceY)) {
        return INFINITECOST;
    }
    if (!IsValidCell(SourceX + action->dX, SourceY + action->dY)) {
        return INFINITECOST;
    }

    if (EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY] >=
        EnvNAVXYTHETALATCfg.cost_inscribed_thresh)
    {
        return INFINITECOST;
    }

    // need to iterate over discretized center cells and compute cost based on them
    unsigned char maxcellcost = 0;
    for (i = 0; i < (int)action->interm3DcellsV.size(); i++) {
        interm3Dcell = action->interm3DcellsV.at(i);
        interm3Dcell.x = interm3Dcell.x + SourceX;
        interm3Dcell.y = interm3Dcell.y + SourceY;

        if (interm3Dcell.x < 0 || interm3Dcell.x >= EnvNAVXYTHETALATCfg.EnvWidth_c ||
            interm3Dcell.y < 0 || interm3Dcell.y >= EnvNAVXYTHETALATCfg.EnvHeight_c)
        {
            return INFINITECOST;
        }

        maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[interm3Dcell.x][interm3Dcell.y]);

        // check that the robot is NOT in the cell at which there is no valid orientation
        if (maxcellcost >= EnvNAVXYTHETALATCfg.cost_inscribed_thresh) {
            return INFINITECOST;
        }
    }

    // check collisions that for the particular footprint orientation along the action
    if (EnvNAVXYTHETALATCfg.FootprintPolygon.size() > 1 &&
        (int)maxcellcost >= EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh)
    {
        checks++;

        for (i = 0; i < (int)action->intersectingcellsV.size(); i++) {
            // get the cell in the map
            cell = action->intersectingcellsV.at(i);
            cell.x = cell.x + SourceX;
            cell.y = cell.y + SourceY;

            // check validity
            if (!IsValidCell(cell.x, cell.y)) {
                return INFINITECOST;
            }

// cost computation changed: cost = max(cost of centers of the robot along
// action) intersecting cells are only used for collision checking
//            if (EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y] > currentmaxcost) {
//              currentmaxcost = EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y];
//            }
        }
    }

    // to ensure consistency of h2D:
    maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[SourceX][SourceY]);
    int currentmaxcost = (int)__max(
            maxcellcost,
            EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY]);

    // use cell cost as multiplicative factor
    return action->cost * (currentmaxcost + 1);
}